

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyConstraintSolver.cpp
# Opt level: O0

void __thiscall
btMultiBodyConstraintSolver::solveMultiBodyGroup
          (btMultiBodyConstraintSolver *this,btCollisionObject **bodies,int numBodies,
          btPersistentManifold **manifold,int numManifolds,btTypedConstraint **constraints,
          int numConstraints,btMultiBodyConstraint **multiBodyConstraints,
          int numMultiBodyConstraints,btContactSolverInfo *info,btIDebugDraw *debugDrawer,
          btDispatcher *dispatcher)

{
  btPersistentManifold **in_RCX;
  int in_EDX;
  btCollisionObject **in_RSI;
  btSequentialImpulseConstraintSolver *in_RDI;
  int in_R8D;
  btTypedConstraint **in_R9;
  int in_stack_00000010;
  undefined4 in_stack_00000014;
  undefined4 in_stack_00000018;
  undefined4 in_stack_0000001c;
  btIDebugDraw *in_stack_00000020;
  btDispatcher *in_stack_00000028;
  
  in_RDI[1].m_resolveSingleConstraintRowGeneric =
       (btSingleConstraintRowSolver)CONCAT44(in_stack_00000014,in_stack_00000010);
  *(undefined4 *)&in_RDI[1].m_resolveSingleConstraintRowLowerLimit = in_stack_00000018;
  btSequentialImpulseConstraintSolver::solveGroup
            (in_RDI,in_RSI,in_EDX,in_RCX,in_R8D,in_R9,in_stack_00000010,
             (btContactSolverInfo *)CONCAT44(in_stack_0000001c,in_stack_00000018),in_stack_00000020,
             in_stack_00000028);
  in_RDI[1].m_resolveSingleConstraintRowGeneric = (btSingleConstraintRowSolver)0x0;
  *(undefined4 *)&in_RDI[1].m_resolveSingleConstraintRowLowerLimit = 0;
  return;
}

Assistant:

void  btMultiBodyConstraintSolver::solveMultiBodyGroup(btCollisionObject** bodies,int numBodies,btPersistentManifold** manifold,int numManifolds,btTypedConstraint** constraints,int numConstraints,btMultiBodyConstraint** multiBodyConstraints, int numMultiBodyConstraints, const btContactSolverInfo& info, btIDebugDraw* debugDrawer,btDispatcher* dispatcher)
{
	//printf("solveMultiBodyGroup start\n");
	m_tmpMultiBodyConstraints = multiBodyConstraints;
	m_tmpNumMultiBodyConstraints = numMultiBodyConstraints;
	
	btSequentialImpulseConstraintSolver::solveGroup(bodies,numBodies,manifold,numManifolds,constraints,numConstraints,info,debugDrawer,dispatcher);

	m_tmpMultiBodyConstraints = 0;
	m_tmpNumMultiBodyConstraints = 0;
	

}